

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LRNLayerParams::SerializeWithCachedSizes
          (LRNLayerParams *this,CodedOutputStream *output)

{
  uint64 uVar1;
  float fVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  LRNLayerParams *this_local;
  
  fVar2 = alpha(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = alpha(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(1,fVar2,output);
  }
  fVar2 = beta(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = beta(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar2,output);
  }
  uVar1 = localsize(this);
  if (uVar1 != 0) {
    uVar1 = localsize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(3,uVar1,output);
  }
  fVar2 = k(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = k(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(4,fVar2,output);
  }
  return;
}

Assistant:

void LRNLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LRNLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // float alpha = 1;
  if (this->alpha() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(1, this->alpha(), output);
  }

  // float beta = 2;
  if (this->beta() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->beta(), output);
  }

  // uint64 localSize = 3;
  if (this->localsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(3, this->localsize(), output);
  }

  // float k = 4;
  if (this->k() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(4, this->k(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LRNLayerParams)
}